

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

void __thiscall
flatbuffers::ToStringVisitor::ToStringVisitor
          (ToStringVisitor *this,string *delimiter,bool quotes,string *indent,bool vdelimited)

{
  pointer pcVar1;
  
  (this->super_IterationVisitor)._vptr_IterationVisitor = (_func_int **)&PTR_StartSequence_001fb030;
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  (this->s)._M_string_length = 0;
  (this->s).field_2._M_local_buf[0] = '\0';
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  pcVar1 = (delimiter->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->d,pcVar1,pcVar1 + delimiter->_M_string_length);
  this->q = quotes;
  (this->in)._M_dataplus._M_p = (pointer)&(this->in).field_2;
  pcVar1 = (indent->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->in,pcVar1,pcVar1 + indent->_M_string_length);
  this->indent_level = 0;
  this->vector_delimited = vdelimited;
  return;
}

Assistant:

ToStringVisitor(std::string delimiter, bool quotes, std::string indent,
                  bool vdelimited = true)
      : d(delimiter),
        q(quotes),
        in(indent),
        indent_level(0),
        vector_delimited(vdelimited) {}